

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

string_view slang::nextSegment(string_view *path)

{
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  
  __n = 0;
  while( true ) {
    if (path->_M_len == __n) {
      path->_M_len = 0;
      path->_M_str = (char *)0x0;
      return *path;
    }
    if (path->_M_str[__n] == '/') break;
    __n = __n + 1;
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr(path,0,__n);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (path,__n + 1,0xffffffffffffffff);
  path->_M_len = bVar2._M_len;
  path->_M_str = bVar2._M_str;
  sVar3._M_len = bVar1._M_len;
  sVar3._M_str = bVar1._M_str;
  return sVar3;
}

Assistant:

static std::string_view nextSegment(std::string_view& path) {
    for (size_t i = 0; i < path.size(); i++) {
        // NOLINTNEXTLINE
        if (path[i] == fs::path::preferred_separator || path[i] == '/') {
            auto result = path.substr(0, i);
            path = path.substr(i + 1);
            return result;
        }
    }

    auto result = path;
    path = {};
    return result;
}